

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_greedy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  undefined8 uVar6;
  uint uVar7;
  BYTE *pBVar8;
  seqDef *psVar9;
  size_t sVar10;
  int iVar11;
  BYTE *pBVar12;
  BYTE *mEnd;
  uint uVar13;
  U32 UVar14;
  long lVar15;
  int *ip;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  U32 UVar21;
  ulong uVar22;
  BYTE *litEnd;
  BYTE *litEnd_1;
  uint local_b0;
  uint local_ac;
  size_t ofbCandidate;
  BYTE *local_90;
  seqStore_t *local_88;
  ulong local_80;
  uint local_74;
  int local_70;
  U32 maxDistance;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *litLimit_w;
  int *local_50;
  BYTE *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  local_90 = (ms->window).base;
  local_68 = (ms->window).dictBase;
  uVar7 = (ms->window).dictLimit;
  local_80 = (ulong)uVar7;
  uVar19 = (ms->window).lowLimit;
  uVar2 = (ms->cParams).windowLog;
  uVar16 = (ms->cParams).minMatch;
  if (5 < uVar16) {
    uVar16 = 6;
  }
  if (uVar16 < 5) {
    uVar16 = 4;
  }
  local_74 = (ms->cParams).searchLog;
  uVar18 = 6;
  if (local_74 < 6) {
    uVar18 = local_74;
  }
  if (uVar18 < 5) {
    uVar18 = 4;
  }
  local_ac = *rep;
  local_b0 = rep[1];
  ms->lazySkipping = 0;
  local_60 = local_90 + local_80;
  local_50 = (int *)((long)src + (srcSize - 0x10));
  uVar3 = ms->nextToUpdate;
  uVar17 = (ulong)uVar3;
  uVar13 = ((int)local_50 - (int)(local_90 + uVar17)) + 1;
  if (7 < uVar13) {
    uVar13 = 8;
  }
  uVar4 = 0;
  if (local_90 + uVar17 <= local_50) {
    uVar4 = uVar13;
  }
  cVar5 = (char)ms->rowHashLog;
  iEnd = (BYTE *)((long)src + srcSize);
  for (; uVar17 < uVar4 + uVar3; uVar17 = uVar17 + 1) {
    if (uVar16 == 5) {
      uVar22 = *(long *)(local_90 + uVar17) * -0x30e4432345000000;
LAB_00399d85:
      UVar21 = (U32)((uVar22 ^ ms->hashSalt) >> (0x38U - cVar5 & 0x3f));
    }
    else {
      if (uVar16 == 6) {
        uVar22 = *(long *)(local_90 + uVar17) * -0x30e4432340650000;
        goto LAB_00399d85;
      }
      UVar21 = (*(int *)(local_90 + uVar17) * -0x61c8864f ^ (uint)ms->hashSalt) >>
               (0x18U - cVar5 & 0x1f);
    }
    ms->hashCache[(uint)uVar17 & 7] = UVar21;
  }
  local_40 = local_68 + local_80;
  local_48 = local_68 + uVar19;
  ip = (int *)((ulong)(local_60 == (BYTE *)src) + (long)src);
  maxDistance = 1 << ((byte)uVar2 & 0x1f);
  local_70 = uVar7 - 1;
  litLimit_w = iEnd + -0x20;
  pBVar8 = local_90;
  local_88 = seqStore;
  local_38 = rep;
LAB_00399e47:
  do {
    if (local_50 <= ip) {
      *local_38 = local_ac;
      local_38[1] = local_b0;
      return (long)iEnd - (long)src;
    }
    iVar11 = ((int)ip - (int)pBVar8) + 1;
    UVar21 = (ms->window).lowLimit;
    UVar14 = iVar11 - maxDistance;
    if (iVar11 - UVar21 <= maxDistance) {
      UVar14 = UVar21;
    }
    if (ms->loadedDictEnd != 0) {
      UVar14 = UVar21;
    }
    uVar7 = iVar11 - local_ac;
    if ((local_70 - uVar7 < 3) || (iVar11 - UVar14 < local_ac)) {
LAB_00399eaf:
      ofbCandidate = 999999999;
      if (uVar16 == 6) {
        if (uVar18 == 6) {
          uVar17 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)ip,iEnd,&ofbCandidate);
        }
        else if (uVar18 == 5) {
          uVar17 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)ip,iEnd,&ofbCandidate);
        }
        else {
          uVar17 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)ip,iEnd,&ofbCandidate);
        }
      }
      else if (uVar16 == 5) {
        if (uVar18 == 6) {
          uVar17 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)ip,iEnd,&ofbCandidate);
        }
        else if (uVar18 == 5) {
          uVar17 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)ip,iEnd,&ofbCandidate);
        }
        else {
          uVar17 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)ip,iEnd,&ofbCandidate);
        }
      }
      else if (uVar18 == 6) {
        uVar17 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      else if (uVar18 == 5) {
        uVar17 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      else {
        uVar17 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      if (uVar17 < 4) {
        uVar17 = (long)ip - (long)src;
        ip = (int *)((long)ip + (uVar17 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar17);
        pBVar8 = local_90;
        goto LAB_00399e47;
      }
      sVar10 = ofbCandidate;
      if (3 < ofbCandidate) {
        uVar22 = (long)ip + (-(long)local_90 - ofbCandidate) + 3;
        pBVar12 = local_60;
        pBVar8 = local_90;
        if ((uint)uVar22 < (uint)local_80) {
          pBVar12 = local_48;
          pBVar8 = local_68;
        }
        pBVar8 = pBVar8 + (uVar22 & 0xffffffff);
        for (; ((src < ip && (pBVar12 < pBVar8)) && (*(BYTE *)((long)ip + -1) == pBVar8[-1]));
            ip = (int *)((long)ip + -1)) {
          pBVar8 = pBVar8 + -1;
          uVar17 = uVar17 + 1;
        }
        local_b0 = local_ac;
        local_ac = (int)ofbCandidate - 3;
      }
    }
    else {
      if (uVar7 < (uint)local_80) {
        pBVar8 = local_68;
      }
      if (*(int *)((long)ip + 1) != *(int *)(pBVar8 + uVar7)) goto LAB_00399eaf;
      pBVar12 = iEnd;
      if (uVar7 < (uint)local_80) {
        pBVar12 = local_40;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),pBVar8 + (ulong)uVar7 + 4,iEnd,pBVar12,local_60);
      uVar17 = sVar10 + 4;
      sVar10 = 1;
      ip = (int *)((long)ip + 1);
    }
    uVar22 = (long)ip - (long)src;
    pBVar8 = local_88->lit;
    if (litLimit_w < ip) {
      ZSTD_safecopyLiterals(pBVar8,(BYTE *)src,(BYTE *)ip,litLimit_w);
LAB_0039a0b2:
      local_88->lit = local_88->lit + uVar22;
      psVar9 = local_88->sequences;
      if (0xffff < uVar22) {
        local_88->longLengthType = ZSTD_llt_literalLength;
        local_88->longLengthPos = (U32)((ulong)((long)psVar9 - (long)local_88->sequencesStart) >> 3)
        ;
      }
    }
    else {
      uVar6 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar8 = *src;
      *(undefined8 *)(pBVar8 + 8) = uVar6;
      pBVar8 = local_88->lit;
      if (0x10 < uVar22) {
        uVar6 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar8 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar8 + 0x18) = uVar6;
        if (0x20 < (long)uVar22) {
          lVar15 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar15 + 0x20);
            uVar6 = puVar1[1];
            pBVar12 = pBVar8 + lVar15 + 0x20;
            *(undefined8 *)pBVar12 = *puVar1;
            *(undefined8 *)(pBVar12 + 8) = uVar6;
            puVar1 = (undefined8 *)((long)src + lVar15 + 0x30);
            uVar6 = puVar1[1];
            *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar12 + 0x18) = uVar6;
            lVar15 = lVar15 + 0x20;
          } while (pBVar12 + 0x20 < pBVar8 + uVar22);
        }
        goto LAB_0039a0b2;
      }
      local_88->lit = pBVar8 + uVar22;
      psVar9 = local_88->sequences;
    }
    pBVar8 = local_90;
    psVar9->litLength = (U16)uVar22;
    psVar9->offBase = (U32)sVar10;
    if (0xffff < uVar17 - 3) {
      local_88->longLengthType = ZSTD_llt_matchLength;
      local_88->longLengthPos = (U32)((ulong)((long)psVar9 - (long)local_88->sequencesStart) >> 3);
    }
    psVar9->mlBase = (U16)(uVar17 - 3);
    local_88->sequences = psVar9 + 1;
    if (ms->lazySkipping != 0) {
      uVar7 = ms->nextToUpdate;
      uVar22 = (ulong)uVar7;
      uVar19 = ((int)local_50 - (int)(local_90 + uVar22)) + 1;
      if (7 < uVar19) {
        uVar19 = 8;
      }
      if (local_50 < local_90 + uVar22) {
        uVar19 = 0;
      }
      cVar5 = (char)ms->rowHashLog;
      for (; uVar22 < uVar19 + uVar7; uVar22 = uVar22 + 1) {
        if (uVar16 == 5) {
          uVar20 = *(long *)(local_90 + uVar22) * -0x30e4432345000000;
LAB_0039a230:
          UVar21 = (U32)((uVar20 ^ ms->hashSalt) >> (0x38U - cVar5 & 0x3f));
        }
        else {
          if (uVar16 == 6) {
            uVar20 = *(long *)(local_90 + uVar22) * -0x30e4432340650000;
            goto LAB_0039a230;
          }
          UVar21 = (*(int *)(local_90 + uVar22) * -0x61c8864f ^ (uint)ms->hashSalt) >>
                   (0x18U - cVar5 & 0x1f);
        }
        ms->hashCache[(uint)uVar22 & 7] = UVar21;
      }
      ms->lazySkipping = 0;
    }
    uVar7 = local_b0;
    for (ip = (int *)((long)ip + uVar17); local_b0 = uVar7, src = ip, ip <= local_50;
        ip = (int *)((long)ip + sVar10 + 4)) {
      iVar11 = (int)ip - (int)pBVar8;
      UVar21 = (ms->window).lowLimit;
      UVar14 = iVar11 - maxDistance;
      if (iVar11 - UVar21 <= maxDistance) {
        UVar14 = UVar21;
      }
      if (ms->loadedDictEnd != 0) {
        UVar14 = UVar21;
      }
      uVar7 = iVar11 - local_b0;
      pBVar12 = pBVar8;
      if (uVar7 < (uint)local_80) {
        pBVar12 = local_68;
      }
      if (((local_70 - uVar7 < 3) || (iVar11 - UVar14 < local_b0)) ||
         (*ip != *(int *)(pBVar12 + uVar7))) break;
      mEnd = iEnd;
      if (uVar7 < (uint)local_80) {
        mEnd = local_40;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar12 + uVar7) + 4),iEnd,mEnd,local_60)
      ;
      pBVar12 = local_88->lit;
      if (litLimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar12,(BYTE *)ip,(BYTE *)ip,litLimit_w);
      }
      else {
        uVar6 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar12 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar12 + 8) = uVar6;
      }
      psVar9 = local_88->sequences;
      psVar9->litLength = 0;
      psVar9->offBase = 1;
      if (0xffff < sVar10 + 1) {
        local_88->longLengthType = ZSTD_llt_matchLength;
        local_88->longLengthPos = (U32)((ulong)((long)psVar9 - (long)local_88->sequencesStart) >> 3)
        ;
      }
      psVar9->mlBase = (U16)(sVar10 + 1);
      local_88->sequences = psVar9 + 1;
      uVar7 = local_ac;
      local_ac = local_b0;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0);
}